

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<char16_t>::ToEquivClass
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *result)

{
  CharSetNode *pCVar1;
  bool bVar2;
  uint uVar3;
  uint h;
  uint i;
  uint index;
  int j;
  long lVar4;
  char16 local_40 [4];
  Char equivs [4];
  uint acth;
  uint tblidx;
  
  equivs[2] = L'\0';
  equivs[3] = L'\0';
  if ((this->rep).compact.countPlusOne - 1 < 5) {
    Sort(this);
    index = 0;
    while( true ) {
      uVar3 = GetCompactLength(this);
      if (uVar3 <= index) break;
      uVar3 = GetCompactCharU(this,index);
      h = GetCompactCharU(this,index);
      bVar2 = CaseInsensitive::RangeToEquivClass
                        ((uint *)(equivs + 2),uVar3,h,(uint *)equivs,local_40);
      if (bVar2) {
        for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
          Set(result,allocator,local_40[lVar4]);
        }
      }
      else {
        uVar3 = GetCompactCharU(this,index);
        Set(result,allocator,(Char)uVar3);
      }
      index = index + 1;
    }
  }
  else {
    CharBitvec::ToEquivClass<char16_t>
              (&(this->rep).full.direct,allocator,0,(uint *)(equivs + 2),result,0);
    pCVar1 = (this->rep).full.root;
    if (pCVar1 != (CharSetNode *)0x0) {
      (*pCVar1->_vptr_CharSetNode[7])(pCVar1,allocator,2,0,equivs + 2,result);
    }
  }
  return;
}

Assistant:

void CharSet<char16>::ToEquivClass(ArenaAllocator* allocator, CharSet<Char>& result)
    {
        uint tblidx = 0;
        if (IsCompact())
        {
            Sort();
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                uint acth;
                Char equivs[CaseInsensitive::EquivClassSize];
                if (CaseInsensitive::RangeToEquivClass(tblidx, this->GetCompactCharU(i), this->GetCompactCharU(i), acth, equivs))
                {
                    for (int j = 0; j < CaseInsensitive::EquivClassSize; j++)
                    {
                        result.Set(allocator, equivs[j]);
                    }
                }
                else
                {
                    result.Set(allocator, this->GetCompactChar(i));
                }
            }
        }
        else
        {
            rep.full.direct.ToEquivClass<char16>(allocator, 0, tblidx, result);
            if (rep.full.root != nullptr)
            {
                rep.full.root->ToEquivClassW(allocator, CharSetNode::levels - 1, 0, tblidx, result);
            }
        }
    }